

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_function-c.cpp
# Opt level: O3

duckdb_state
duckdb_add_aggregate_function_to_set
          (duckdb_aggregate_function_set set,duckdb_aggregate_function function)

{
  duckdb_state dVar1;
  long lVar2;
  duckdb_aggregate_function p_Var3;
  aggregate_size_t *pp_Var4;
  byte bVar5;
  AggregateFunction local_150;
  
  bVar5 = 0;
  dVar1 = DuckDBError;
  if (function != (duckdb_aggregate_function)0x0 && set != (duckdb_aggregate_function_set)0x0) {
    duckdb::SimpleFunction::SimpleFunction((SimpleFunction *)&local_150,(SimpleFunction *)function);
    local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__BaseScalarFunction_02446ee0;
    duckdb::LogicalType::LogicalType
              (&local_150.super_BaseScalarFunction.return_type,(LogicalType *)(function + 0x90));
    local_150.super_BaseScalarFunction._168_4_ = *(undefined4 *)(function + 0xa8);
    local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_0243ae10;
    p_Var3 = function + 0xb0;
    pp_Var4 = &local_150.state_size;
    for (lVar2 = 0xd; lVar2 != 0; lVar2 = lVar2 + -1) {
      *pp_Var4 = *(aggregate_size_t *)p_Var3;
      p_Var3 = p_Var3 + (ulong)bVar5 * -0x10 + 8;
      pp_Var4 = pp_Var4 + (ulong)bVar5 * -2 + 1;
    }
    local_150._280_2_ = *(undefined2 *)(function + 0x118);
    local_150.function_info.internal.
    super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)(function + 0x120);
    local_150.function_info.internal.
    super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(function + 0x128);
    if (local_150.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_150.function_info.internal.
         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_150.function_info.internal.
              super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_150.function_info.internal.
         super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_150.function_info.internal.
              super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    std::vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_>::
    emplace_back<duckdb::AggregateFunction>
              ((vector<duckdb::AggregateFunction,_std::allocator<duckdb::AggregateFunction>_> *)
               (set + 0x20),&local_150);
    local_150.super_BaseScalarFunction.super_SimpleFunction.super_Function._vptr_Function =
         (_func_int **)&PTR__AggregateFunction_0243ae10;
    if (local_150.function_info.internal.
        super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_150.function_info.internal.
                 super___shared_ptr<duckdb::AggregateFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    duckdb::BaseScalarFunction::~BaseScalarFunction(&local_150.super_BaseScalarFunction);
    dVar1 = DuckDBSuccess;
  }
  return dVar1;
}

Assistant:

duckdb_state duckdb_add_aggregate_function_to_set(duckdb_aggregate_function_set set,
                                                  duckdb_aggregate_function function) {
	if (!set || !function) {
		return DuckDBError;
	}
	auto &aggregate_function_set = duckdb::GetCAggregateFunctionSet(set);
	auto &aggregate_function = GetCAggregateFunction(function);
	aggregate_function_set.AddFunction(aggregate_function);
	return DuckDBSuccess;
}